

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

int Abc_NtkCountPis(Vec_Ptr_t *vSupp)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vSupp->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vSupp,i);
    iVar2 = iVar2 + (uint)((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 2);
  }
  return iVar2;
}

Assistant:

int Abc_NtkCountPis( Vec_Ptr_t * vSupp )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        Counter += Abc_ObjIsPi(pObj);
    return Counter;
}